

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughMeshTransformInfoHTC *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrVector3f *pXVar6;
  XrStructureType __val;
  string *psVar7;
  uint uVar8;
  char cVar9;
  bool bVar10;
  char cVar11;
  char *pcVar12;
  XrInstance pXVar13;
  invalid_argument *piVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  XrGeneratedDispatchTable *pXVar20;
  uint uVar21;
  string type_prefix;
  string next_prefix;
  string vertices_prefix;
  string vertexcount_prefix;
  string time_prefix;
  string basespace_prefix;
  string pose_prefix;
  string indexcount_prefix;
  string indices_prefix;
  string scale_prefix;
  ostringstream oss_vertexCount;
  ostringstream oss_baseSpace;
  ostringstream oss_indices_array;
  ostringstream oss_indexCount;
  ostringstream oss_vertices_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  long *local_990;
  long local_988;
  long local_980 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  string *local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  string local_888;
  long *local_868;
  long local_860;
  long local_858 [2];
  undefined1 local_848 [16];
  PFN_xrEnumerateInstanceExtensionProperties local_838;
  undefined1 local_828 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818;
  string local_808;
  undefined1 local_7e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  string local_7c8;
  string local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  PFN_xrCreateSwapchain local_768;
  PFN_xrCreateActionSpace p_Stack_760;
  PFN_xrLocateSpace local_758;
  PFN_xrAcquireSwapchainImage p_Stack_750;
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  paVar1 = &local_788.field_2;
  local_788._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_788,'\x12');
  *local_788._M_dataplus._M_p = '0';
  local_788._M_dataplus._M_p[1] = 'x';
  pcVar12 = local_788._M_dataplus._M_p + local_788._M_string_length + -1;
  lVar16 = 0;
  do {
    bVar2 = local_1a8[lVar16];
    *pcVar12 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar12[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar16 = lVar16 + 1;
    pcVar12 = pcVar12 + -2;
  } while (lVar16 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != paVar1) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9b0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_9b0);
  local_930 = prefix;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar21 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar19 = (ulong)__val;
      uVar8 = 4;
      do {
        uVar21 = uVar8;
        uVar15 = (uint)uVar19;
        if (uVar15 < 100) {
          uVar21 = uVar21 - 2;
          goto LAB_001e70a4;
        }
        if (uVar15 < 1000) {
          uVar21 = uVar21 - 1;
          goto LAB_001e70a4;
        }
        if (uVar15 < 10000) goto LAB_001e70a4;
        uVar19 = uVar19 / 10000;
        uVar8 = uVar21 + 4;
      } while (99999 < uVar15);
      uVar21 = uVar21 + 1;
    }
LAB_001e70a4:
    local_788._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_788,(char)uVar21 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_788._M_dataplus._M_p + (XVar3 >> 0x1f),uVar21,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_9b0,&local_788);
    prefix = local_930;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != paVar1) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_758 = (PFN_xrLocateSpace)0x0;
    p_Stack_750 = (PFN_xrAcquireSwapchainImage)0x0;
    local_768 = (PFN_xrCreateSwapchain)0x0;
    p_Stack_760 = (PFN_xrCreateActionSpace)0x0;
    local_788.field_2._M_allocated_capacity = 0;
    local_788.field_2._8_8_ = 0;
    local_788._M_dataplus._M_p = (pointer)0x0;
    local_788._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar13 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar13,value->type,(char *)&local_788);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_9b0,(char (*) [64])&local_788);
  }
  local_990 = local_980;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_990,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_990);
  value_00 = value->next;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a8,local_990,local_988 + (long)local_990);
  bVar10 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_7a8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_950,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_950);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_788,"0x",2);
  *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_788);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_950,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrPassthroughMeshTransformInfoHTC *)local_1a8._0_8_ !=
      (XrPassthroughMeshTransformInfoHTC *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  pcVar4 = (local_930->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_970,pcVar4,pcVar4 + local_930->_M_string_length);
  std::__cxx11::string::append((char *)&local_970);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[18],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [18])"const XrVector3f*",&local_970,local_320);
  paVar1 = &local_320[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (value->vertexCount != 0) {
    uVar19 = 0;
    do {
      local_320[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_320,local_970._M_dataplus._M_p,
                 local_970._M_dataplus._M_p + local_970._M_string_length);
      std::__cxx11::string::append((char *)local_320);
      cVar11 = '\x01';
      if (9 < uVar19) {
        uVar18 = uVar19;
        cVar9 = '\x04';
        do {
          cVar11 = cVar9;
          uVar21 = (uint)uVar18;
          if (uVar21 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_001e73f9;
          }
          if (uVar21 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_001e73f9;
          }
          if (uVar21 < 10000) goto LAB_001e73f9;
          uVar18 = (uVar18 & 0xffffffff) / 10000;
          cVar9 = cVar11 + '\x04';
        } while (99999 < uVar21);
        cVar11 = cVar11 + '\x01';
      }
LAB_001e73f9:
      local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
      std::__cxx11::string::_M_construct((ulong)local_498,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_498[0]._M_dataplus._M_p,(uint)local_498[0]._M_string_length,(uint)uVar19);
      std::__cxx11::string::_M_append((char *)local_320,(ulong)local_498[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        (ulong)(local_498[0].field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::append((char *)local_320);
      pXVar6 = value->vertices;
      local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_888,local_320[0]._M_dataplus._M_p,
                 (PFN_xrGetMarkerReprojectionErrorML)
                 (local_320[0]._M_string_length + (long)local_320[0]._M_dataplus._M_p));
      local_848._0_8_ = local_848 + 0x10;
      pXVar20 = (XrGeneratedDispatchTable *)local_848;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"const XrVector3f*","");
      bVar10 = ApiDumpOutputXrStruct
                         (pXVar20,pXVar6 + uVar19,&local_888,(string *)local_848,false,contents);
      if ((undefined1 *)local_848._0_8_ != local_848 + 0x10) {
        operator_delete((void *)local_848._0_8_,(ulong)(local_838 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_888._M_dataplus._M_p != &local_888.field_2) {
        operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
        __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < value->vertexCount);
  }
  psVar7 = local_930;
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  pcVar4 = (local_930->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8c8,pcVar4,pcVar4 + local_930->_M_string_length);
  std::__cxx11::string::append((char *)&local_8c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_8c8,local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    (ulong)(local_498[0].field_2._M_allocated_capacity + 1));
  }
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  pcVar4 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8a8,pcVar4,pcVar4 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)&local_8a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"const uint32_t*",&local_8a8,local_610);
  paVar1 = &local_610[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_610[0]._M_dataplus._M_p,
                    (ulong)(local_610[0].field_2._M_allocated_capacity + 1));
  }
  if (value->indexCount != 0) {
    uVar19 = 0;
    do {
      local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_908,local_8a8._M_dataplus._M_p,
                 local_8a8._M_dataplus._M_p + local_8a8._M_string_length);
      std::__cxx11::string::append((char *)&local_908);
      cVar11 = '\x01';
      if (9 < uVar19) {
        uVar18 = uVar19;
        cVar9 = '\x04';
        do {
          cVar11 = cVar9;
          uVar21 = (uint)uVar18;
          if (uVar21 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_001e77f2;
          }
          if (uVar21 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_001e77f2;
          }
          if (uVar21 < 10000) goto LAB_001e77f2;
          uVar18 = (uVar18 & 0xffffffff) / 10000;
          cVar9 = cVar11 + '\x04';
        } while (99999 < uVar21);
        cVar11 = cVar11 + '\x01';
      }
LAB_001e77f2:
      local_610[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)local_610,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_610[0]._M_dataplus._M_p,(uint)local_610[0]._M_string_length,(uint)uVar19);
      std::__cxx11::string::_M_append((char *)&local_908,(ulong)local_610[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_610[0]._M_dataplus._M_p,
                        (ulong)(local_610[0].field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::append((char *)&local_908);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"0x",2);
      *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8)
           = *(uint *)((long)&local_610[0].field_2 +
                      *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)local_610);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [16])"const uint32_t*",&local_908,&local_928);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_928._M_dataplus._M_p != &local_928.field_2) {
        operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
      std::ios_base::~ios_base(local_5a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < value->indexCount);
  }
  psVar7 = local_930;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  pcVar4 = (local_930->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_908,pcVar4,pcVar4 + local_930->_M_string_length);
  std::__cxx11::string::append((char *)&local_908);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
  *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_610);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&local_908,&local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (psVar7->_M_dataplus)._M_p;
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_928,pcVar4,pcVar4 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)&local_928);
  uVar19 = value->time;
  uVar18 = -uVar19;
  if (0 < (long)uVar19) {
    uVar18 = uVar19;
  }
  uVar21 = 1;
  if (9 < uVar18) {
    uVar17 = uVar18;
    uVar8 = 4;
    do {
      uVar21 = uVar8;
      if (uVar17 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_001e7ac6;
      }
      if (uVar17 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_001e7ac6;
      }
      if (uVar17 < 10000) goto LAB_001e7ac6;
      bVar10 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      uVar8 = uVar21 + 4;
    } while (bVar10);
    uVar21 = uVar21 + 1;
  }
LAB_001e7ac6:
  paVar1 = &local_8e8.field_2;
  local_8e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_8e8,(char)uVar21 - (char)((long)uVar19 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_8e8._M_dataplus._M_p + -((long)uVar19 >> 0x3f),uVar21,uVar18);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&local_928,&local_8e8);
  psVar7 = local_930;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (psVar7->_M_dataplus)._M_p;
  local_8e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8e8,pcVar4,pcVar4 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)&local_8e8);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7c8,local_8e8._M_dataplus._M_p,
             local_8e8._M_dataplus._M_p + local_8e8._M_string_length);
  pXVar20 = (XrGeneratedDispatchTable *)local_7e8;
  local_7e8._0_8_ = local_7e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"XrPosef","");
  bVar10 = ApiDumpOutputXrStruct(pXVar20,&value->pose,&local_7c8,(string *)local_7e8,false,contents)
  ;
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,(ulong)(local_7d8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,(ulong)(local_7c8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (!bVar10) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar4 = (psVar7->_M_dataplus)._M_p;
  local_868 = local_858;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_868,pcVar4,pcVar4 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)&local_868);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_808,local_868,local_860 + (long)local_868);
  pXVar20 = (XrGeneratedDispatchTable *)local_828;
  local_828._0_8_ = local_828 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"XrVector3f","");
  bVar10 = ApiDumpOutputXrStruct
                     (pXVar20,&value->scale,&local_808,(string *)local_828,false,contents);
  if ((undefined1 *)local_828._0_8_ != local_828 + 0x10) {
    operator_delete((void *)local_828._0_8_,(ulong)(local_818._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,(ulong)(local_808.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar10) {
    if (local_868 != local_858) {
      operator_delete(local_868,local_858[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_928._M_dataplus._M_p != &local_928.field_2) {
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    std::ios_base::~ios_base(local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_908._M_dataplus._M_p != &local_908.field_2) {
      operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
      operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
      operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_970._M_dataplus._M_p != &local_970.field_2) {
      operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
    std::ios_base::~ios_base(local_718);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_950._M_dataplus._M_p != &local_950.field_2) {
      operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
    }
    if (local_990 != local_980) {
      operator_delete(local_990,local_980[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
      operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
  __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughMeshTransformInfoHTC* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexcount_prefix = prefix;
        vertexcount_prefix += "vertexCount";
        std::ostringstream oss_vertexCount;
        oss_vertexCount << "0x" << std::hex << (value->vertexCount);
        contents.emplace_back("uint32_t", vertexcount_prefix, oss_vertexCount.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices_array;
        oss_vertices_array << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("const XrVector3f*", vertices_prefix, oss_vertices_array.str());
        for (uint32_t value_vertices_inc = 0; value_vertices_inc < value->vertexCount; ++value_vertices_inc) {
            std::string vertices_array_prefix = vertices_prefix;
            vertices_array_prefix += "[";
            vertices_array_prefix += std::to_string(value_vertices_inc);
            vertices_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->vertices[value_vertices_inc], vertices_array_prefix, "const XrVector3f*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        std::string indexcount_prefix = prefix;
        indexcount_prefix += "indexCount";
        std::ostringstream oss_indexCount;
        oss_indexCount << "0x" << std::hex << (value->indexCount);
        contents.emplace_back("uint32_t", indexcount_prefix, oss_indexCount.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices_array;
        oss_indices_array << std::hex << (value->indices);
        contents.emplace_back("const uint32_t*", indices_prefix, oss_indices_array.str());
        for (uint32_t value_indices_inc = 0; value_indices_inc < value->indexCount; ++value_indices_inc) {
            std::string indices_array_prefix = indices_prefix;
            indices_array_prefix += "[";
            indices_array_prefix += std::to_string(value_indices_inc);
            indices_array_prefix += "]";
            std::ostringstream oss_indices;
            oss_indices << "0x" << std::hex << (value->indices[value_indices_inc]);
            contents.emplace_back("const uint32_t*", indices_array_prefix, oss_indices.str());
        }
        std::string basespace_prefix = prefix;
        basespace_prefix += "baseSpace";
        std::ostringstream oss_baseSpace;
        oss_baseSpace << std::hex << reinterpret_cast<const void*>(value->baseSpace);
        contents.emplace_back("XrSpace", basespace_prefix, oss_baseSpace.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string scale_prefix = prefix;
        scale_prefix += "scale";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->scale, scale_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}